

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  byte bVar2;
  FileDescriptorProto *in_RDX;
  LocationRecorder *in_RSI;
  EnumValueDescriptorProto *in_RDI;
  EnumDescriptorProto *unaff_retaddr;
  Parser *in_stack_00000008;
  LocationRecorder location_1;
  Parser *in_stack_00000048;
  LocationRecorder location;
  OptionStyle in_stack_000002bc;
  FileDescriptorProto *in_stack_000002c0;
  LocationRecorder *in_stack_000002c8;
  Message *in_stack_000002d0;
  Parser *in_stack_000002d8;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Parser *in_stack_ffffffffffffff70;
  LocationRecorder *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  FileDescriptorProto *containing_file_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = TryConsumeEndOfDeclaration
                    (in_stack_00000048,(char *)location_1.location_,
                     (LocationRecorder *)location_1.source_code_info_);
  if (bVar1) {
    bVar2 = 1;
  }
  else {
    bVar1 = LookingAt(in_stack_ffffffffffffff70,
                      (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      EnumDescriptorProto::mutable_options((EnumDescriptorProto *)0x6114fc);
      bVar2 = ParseOption(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
                          in_stack_000002bc);
      LocationRecorder::~LocationRecorder
                ((LocationRecorder *)CONCAT17(bVar2,in_stack_ffffffffffffff80));
    }
    else {
      bVar1 = LookingAt(in_stack_ffffffffffffff70,
                        (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if (bVar1) {
        bVar2 = ParseReserved(in_stack_00000008,unaff_retaddr,
                              (LocationRecorder *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      }
      else {
        containing_file_00 = in_RDX;
        EnumDescriptorProto::value_size((EnumDescriptorProto *)0x6115b4);
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                   ,in_stack_ffffffffffffff78,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
        EnumDescriptorProto::add_value((EnumDescriptorProto *)0x6115d7);
        bVar2 = ParseEnumConstant((Parser *)
                                  CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI,containing_file_00);
        LocationRecorder::~LocationRecorder
                  ((LocationRecorder *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                  );
      }
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("reserved")) {
    return ParseReserved(enum_type, enum_location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kValueFieldNumber,
                              enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}